

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteBndRangeOrCompl
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *this,File *nm,
          double L,double U,int k,int cvar)

{
  int in_ECX;
  uint in_EDX;
  char *pcVar1;
  File *in_RSI;
  TextFormatter *in_RDI;
  TextFormatter *in_XMM0_Qa;
  double dVar2;
  TextFormatter *in_XMM1_Qa;
  char *local_60;
  
  if ((int)in_EDX < 1) {
    dVar2 = NegInfty((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                     0x139c3d);
    if (dVar2 < (double)in_XMM0_Qa) {
      dVar2 = Infty((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                    0x139cc4);
      if ((double)in_XMM1_Qa < dVar2) {
        local_60 = "0 %.16g %.16g\n";
        if ((double)in_XMM0_Qa == (double)in_XMM1_Qa) {
          local_60 = "4 %.16g\n";
        }
      }
      else {
        local_60 = "2 %.16g\n";
      }
      TextFormatter::apr(in_XMM0_Qa,(File *)in_XMM1_Qa,(char *)in_RDI,in_RSI,local_60);
    }
    else {
      dVar2 = Infty((NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *)
                    0x139c69);
      pcVar1 = "1 %.16g\n";
      if (dVar2 <= (double)in_XMM1_Qa) {
        pcVar1 = "3\n";
      }
      TextFormatter::apr(in_XMM1_Qa,(File *)in_RDI,(char *)in_RSI,pcVar1);
    }
  }
  else {
    TextFormatter::apr(in_RDI,in_RSI,"5 %d %d\n",(ulong)in_EDX,(ulong)(in_ECX + 1));
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteBndRangeOrCompl(
    File& nm,
    double L, double U, int k, int cvar) {
  if (k<=0) {          // normal algebraic constraint
    if (L <= NegInfty())
      apr(nm, U >= Infty()
          ? "3\n" : "1 %.16g\n", U);
    else
      apr(nm, U >= Infty() ? "2 %.16g\n"
                           : L == U ? "4 %.16g\n"
                                    : "0 %.16g %.16g\n",
          L, U);
  } else {             // complementarity
    apr(nm, "5 %d %d\n", k, cvar + 1);   // add +1 here
  }
}